

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O3

void Fra_SmlAssignDist1(Fra_Sml_t *p,uint *pPat)

{
  uint *puVar1;
  uint uVar2;
  Aig_Man_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  
  iVar6 = p->nFrames;
  if (iVar6 < 1) {
    __assert_fail("p->nFrames > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSim.c"
                  ,0x1b5,"void Fra_SmlAssignDist1(Fra_Sml_t *, unsigned int *)");
  }
  pAVar3 = p->pAig;
  if (iVar6 == 1) {
    pVVar4 = pAVar3->vCis;
    if (0 < pVVar4->nSize) {
      uVar12 = 0;
      do {
        Fra_SmlAssignConst(p,(Aig_Obj_t *)pVVar4->pArray[uVar12],
                           (uint)((pPat[uVar12 >> 5 & 0x7ffffff] >> ((uint)uVar12 & 0x1f) & 1) != 0)
                           ,0);
        uVar12 = uVar12 + 1;
        pAVar3 = p->pAig;
        pVVar4 = pAVar3->vCis;
      } while ((long)uVar12 < (long)pVVar4->nSize);
    }
    uVar5 = p->nWordsTotal * 0x20 - 1;
    if (pAVar3->nObjs[2] < (int)uVar5) {
      uVar5 = pAVar3->nObjs[2];
    }
    if (0 < (int)uVar5) {
      uVar12 = 1;
      do {
        if ((long)pVVar4->nSize <= (long)(uVar12 - 1)) {
LAB_0060ce65:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        puVar1 = (uint *)((long)&p[1].pAig +
                         (uVar12 >> 5 & 0x7ffffff) * 4 +
                         (long)p->nWordsTotal *
                         (long)*(int *)((long)pVVar4->pArray[uVar12 - 1] + 0x24) * 4);
        *puVar1 = *puVar1 ^ 1 << ((byte)uVar12 & 0x1f);
        bVar14 = uVar12 != uVar5;
        uVar12 = uVar12 + 1;
      } while (bVar14);
    }
  }
  else {
    iVar9 = pAVar3->nObjs[2] - pAVar3->nRegs;
    iVar11 = 0;
    lVar13 = 0;
    do {
      iVar7 = pAVar3->nRegs;
      iVar8 = pAVar3->nObjs[2];
      if (iVar7 < iVar8) {
        lVar10 = 0;
        do {
          if (pAVar3->vCis->nSize <= lVar10) goto LAB_0060ce65;
          uVar5 = (int)lVar10 + iVar11;
          Fra_SmlAssignConst(p,(Aig_Obj_t *)pAVar3->vCis->pArray[lVar10],
                             (uint)((pPat[(int)uVar5 >> 5] >> (uVar5 & 0x1f) & 1) != 0),(int)lVar13)
          ;
          lVar10 = lVar10 + 1;
          pAVar3 = p->pAig;
          iVar7 = pAVar3->nRegs;
          iVar8 = pAVar3->nObjs[2];
        } while (lVar10 < iVar8 - iVar7);
        iVar6 = p->nFrames;
      }
      lVar13 = lVar13 + 1;
      iVar11 = iVar11 + iVar9;
    } while (lVar13 < iVar6);
    pVVar4 = pAVar3->vCis;
    uVar5 = iVar8 - iVar7;
    if ((int)uVar5 < pVVar4->nSize) {
      lVar13 = 0;
      do {
        if ((int)uVar5 < 0) goto LAB_0060ce65;
        uVar2 = p->nFrames * iVar9 + (int)lVar13;
        Fra_SmlAssignConst(p,(Aig_Obj_t *)pVVar4->pArray[(ulong)uVar5 + lVar13],
                           (uint)((pPat[(int)uVar2 >> 5] >> (uVar2 & 0x1f) & 1) != 0),0);
        pVVar4 = p->pAig->vCis;
        lVar13 = lVar13 + 1;
      } while ((int)(uVar5 + (int)lVar13) < pVVar4->nSize);
    }
  }
  return;
}

Assistant:

void Fra_SmlAssignDist1( Fra_Sml_t * p, unsigned * pPat )
{
    Aig_Obj_t * pObj;
    int f, i, k, Limit, nTruePis;
    assert( p->nFrames > 0 );
    if ( p->nFrames == 1 )
    {
        // copy the PI info 
        Aig_ManForEachCi( p->pAig, pObj, i )
            Fra_SmlAssignConst( p, pObj, Abc_InfoHasBit(pPat, i), 0 );
        // flip one bit
        Limit = Abc_MinInt( Aig_ManCiNum(p->pAig), p->nWordsTotal * 32 - 1 );
        for ( i = 0; i < Limit; i++ )
            Abc_InfoXorBit( Fra_ObjSim( p, Aig_ManCi(p->pAig,i)->Id ), i+1 );
    }
    else
    {
        int fUseDist1 = 0;

        // copy the PI info for each frame
        nTruePis = Aig_ManCiNum(p->pAig) - Aig_ManRegNum(p->pAig);
        for ( f = 0; f < p->nFrames; f++ )
            Aig_ManForEachPiSeq( p->pAig, pObj, i )
                Fra_SmlAssignConst( p, pObj, Abc_InfoHasBit(pPat, nTruePis * f + i), f );
        // copy the latch info 
        k = 0;
        Aig_ManForEachLoSeq( p->pAig, pObj, i )
            Fra_SmlAssignConst( p, pObj, Abc_InfoHasBit(pPat, nTruePis * p->nFrames + k++), 0 );
//        assert( p->pManFraig == NULL || nTruePis * p->nFrames + k == Aig_ManCiNum(p->pManFraig) );

        // flip one bit of the last frame
        if ( fUseDist1 ) //&& p->nFrames == 2 )
        {
            Limit = Abc_MinInt( nTruePis, p->nWordsFrame * 32 - 1 );
            for ( i = 0; i < Limit; i++ )
                Abc_InfoXorBit( Fra_ObjSim( p, Aig_ManCi(p->pAig, i)->Id ) + p->nWordsFrame*(p->nFrames-1), i+1 );
        }
    }
}